

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Choice(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  int c;
  Gia_Man_t *pTemp;
  Cec_ParChc_t *pPars;
  Cec_ParChc_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._20_8_ = argv;
  Cec_ManChcSetDefaultParams((Cec_ParChc_t *)((long)&pPars + 4));
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,(char **)Pars._20_8_,"Ccvh");
      if (iVar1 == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Choice(): There is no AIG.\n");
          return 1;
        }
        pNew = Cec_ManChoiceComputation(pAbc->pGia,(Cec_ParChc_t *)((long)&pPars + 4));
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 99) {
        Pars.nBTLimit = Pars.nBTLimit ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_002a9bb1;
        Pars.fUseCSat = Pars.fUseCSat ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    Pars.nWords = atoi(*(char **)(Pars._20_8_ + (long)globalUtilOptind * 8));
    globalUtilOptind = globalUtilOptind + 1;
    if (Pars.nWords < 0) {
LAB_002a9bb1:
      Abc_Print(-2,"usage: &choice [-C num] [-cvh]\n");
      Abc_Print(-2,"\t         performs computation of structural choices\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      pcVar2 = "no";
      if (Pars.nBTLimit != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (Pars.fUseCSat != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_002a9bb1;
}

Assistant:

int Abc_CommandAbc9Choice( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParChc_t Pars, * pPars = &Pars;
    Gia_Man_t * pTemp;
    int c;
    Cec_ManChcSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ccvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Choice(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Cec_ManChoiceComputation( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &choice [-C num] [-cvh]\n" );
    Abc_Print( -2, "\t         performs computation of structural choices\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}